

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AmpIO.cpp
# Opt level: O2

void __thiscall AmpIO::CheckCollectCallback(AmpIO *this)

{
  bool bVar1;
  ushort uVar2;
  uint uVar3;
  ostream *poVar4;
  unsigned_short nquads;
  uchar fpgaChan;
  bool fpgaCollecting;
  unsigned_short collect_windex;
  uchar local_1c;
  bool local_1b;
  ushort local_1a;
  
  if (this->collect_cb == (CollectCallback)0x0) {
    return;
  }
  bVar1 = GetCollectionStatus(this,&local_1b,&local_1c,&local_1a);
  if (!bVar1) {
    poVar4 = std::operator<<((ostream *)&std::cerr,
                             "CheckCollectCallback: failed to get collection status");
    std::endl<char,std::char_traits<char>>(poVar4);
    return;
  }
  if ((this->collect_state == true) && (local_1b != true)) {
    return;
  }
  if (local_1c != this->collect_chan) {
    poVar4 = std::operator<<((ostream *)&std::cerr,"CheckCollectCallback: channel mismatch: ");
    poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)poVar4);
    poVar4 = std::operator<<(poVar4,", ");
    poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)poVar4);
    std::endl<char,std::char_traits<char>>(poVar4);
  }
  uVar2 = local_1a + 0x400;
  if (this->collect_rindex <= local_1a) {
    uVar2 = local_1a;
  }
  nquads = uVar2 - this->collect_rindex;
  if (nquads != 0) {
    uVar3 = (*((this->super_FpgaIO).super_BoardIO.port)->_vptr_BasePort[0x19])();
    if (uVar3 >> 2 < (uint)nquads) {
      uVar3 = (*((this->super_FpgaIO).super_BoardIO.port)->_vptr_BasePort[0x19])();
      nquads = (unsigned_short)(uVar3 >> 2);
    }
    bVar1 = ReadCollectedData(this,this->collect_data,this->collect_rindex,nquads);
    if (bVar1) {
      uVar2 = this->collect_rindex + nquads;
      this->collect_rindex = uVar2;
      if (0x3ff < uVar2) {
        this->collect_rindex = uVar2 - 0x400;
      }
      goto LAB_001090dd;
    }
  }
  nquads = 0;
LAB_001090dd:
  bVar1 = (*this->collect_cb)(this->collect_data,nquads);
  if (!bVar1) {
    this->collect_state = false;
  }
  return;
}

Assistant:

void AmpIO::CheckCollectCallback()
{
    if (collect_cb == 0) return;
    bool fpgaCollecting;
    unsigned char fpgaChan;
    unsigned short collect_windex;
    if (!GetCollectionStatus(fpgaCollecting, fpgaChan, collect_windex)) {
        std::cerr << "CheckCollectCallback: failed to get collection status" << std::endl;
        return;
    }
    // Wait to make sure FPGA is collecting data
    if (collect_state && !fpgaCollecting)
        return;
    if (fpgaChan != collect_chan) {
        std::cerr << "CheckCollectCallback: channel mismatch: "
                  << static_cast<unsigned int>(fpgaChan) << ", "
                  << static_cast<unsigned int>(collect_chan) << std::endl;
        // Continue processing
    }
    // Figure out how much data is available
    // (this implementation works correctly for unsigned integers)
    unsigned short numAvail = (collect_windex >= collect_rindex) ? (collect_windex-collect_rindex)
                                                                 : (COLLECT_BUFSIZE +collect_windex-collect_rindex);
    if (numAvail > 0) {
        if (numAvail > (port->GetMaxReadDataSize()/sizeof(quadlet_t)))
            numAvail = static_cast<unsigned short>(port->GetMaxReadDataSize()/sizeof(quadlet_t));
        if (ReadCollectedData(collect_data, collect_rindex, numAvail)) {
            collect_rindex += numAvail;
            if (collect_rindex >= COLLECT_BUFSIZE)
                collect_rindex -= COLLECT_BUFSIZE;
        }
        else
            numAvail = 0;
    }
    if (!(*collect_cb)(collect_data, numAvail))
        DataCollectionStop();
}